

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O0

void solvequeue(Item *q1,Item *q2,int blocktype,Item *qerr)

{
  int iVar1;
  Item *pIVar2;
  char *pcVar3;
  List *list;
  Symbol *sym;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  Item *in_RDI;
  List *errstmt;
  Item *qtemp;
  Item *lq;
  Symbol *in_stack_ffffffffffffffc8;
  List *in_stack_ffffffffffffffd0;
  Item *local_28;
  
  if (solvq == (List *)0x0) {
    solvq = newlist();
  }
  if (in_EDX == 0x130) {
    if (nrnstate == (List *)0x0) {
      nrnstate = newlist();
    }
    lappendstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    if (in_RCX == 0) {
      if (in_RSI == 0) {
        movelist(in_stack_ffffffffffffffd0,(Item *)in_stack_ffffffffffffffc8,(List *)0x10fc27);
      }
      else {
        movelist(in_stack_ffffffffffffffd0,(Item *)in_stack_ffffffffffffffc8,(List *)0x10fc06);
      }
    }
    else {
      movelist(in_stack_ffffffffffffffd0,(Item *)in_stack_ffffffffffffffc8,(List *)0x10fbdd);
    }
    lappendstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  }
  if (massage_list_ != (List *)0x0) {
    for (local_28 = massage_list_->next; local_28 != massage_list_; local_28 = local_28->next) {
      iVar1 = strcmp(((local_28->element).sym)->name,((in_RDI->element).sym)->name);
      if (iVar1 == 0) {
        diag((char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      }
    }
  }
  pIVar2 = lappendsym(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (pIVar2->element).itm = in_RDI;
  pIVar2->itemtype = (short)in_EDX;
  if ((in_RDI->next->itemtype == 1) &&
     (iVar1 = strcmp("STEADYSTATE",((in_RDI->next->element).sym)->name), iVar1 == 0)) {
    pIVar2->itemtype = -(short)in_EDX;
  }
  if (in_RSI == 0) {
    list = in_RDI->next;
    lappendsym(list,in_stack_ffffffffffffffc8);
  }
  else {
    list = *(List **)(in_RSI + 0x10);
    lappendsym(list,in_stack_ffffffffffffffc8);
    iVar1 = strcmp(*(char **)(*(long *)(in_RSI + 8) + 0x48),"derivimplicit");
    if (iVar1 == 0) {
      add_deriv_imp_list((char *)0x10fda0);
      add_deriv_imp_really((char *)0x10fdb4);
    }
    iVar1 = strcmp(*(char **)(*(long *)(in_RSI + 8) + 0x48),"cnexp");
    if (iVar1 == 0) {
      pcVar3 = stralloc((char *)list,(char *)in_stack_ffffffffffffffc8);
      *(char **)(*(long *)(in_RSI + 8) + 0x48) = pcVar3;
      add_deriv_imp_list((char *)0x10fe11);
      cvode_cnexp_solve = pIVar2;
    }
    iVar1 = strcmp(*(char **)(*(long *)(in_RSI + 8) + 0x48),"euler");
    if (iVar1 == 0) {
      add_deriv_imp_really((char *)0x10fe4f);
    }
    delete((Item *)0x10fe5f);
    delete((Item *)0x10fe6b);
  }
  delete((Item *)0x10fe9d);
  if (in_RCX == 0) {
    pcVar3 = current_line();
    sprintf(buf,"if(error){fprintf(stderr,\"%s\\n\"); nrn_complain(_p); abort_run(error);}\n",pcVar3
           );
    list = insertstr(list,(char *)in_stack_ffffffffffffffc8);
  }
  else {
    replacstr(list,(char *)in_stack_ffffffffffffffc8);
  }
  sym = (Symbol *)newlist();
  pIVar2 = lappendsym(list,sym);
  (pIVar2->element).itm = (Item *)sym;
  movelist(list,(Item *)sym,(List *)0x10ff3a);
  return;
}

Assistant:

void solvequeue(q1, q2, blocktype, qerr) /*solve NAME=q1 [using METHOD=q2]*/
				/* q2 = 0 means method wasn't there */
				/* qerr in ITEM0 or else the closing
				   brace of an IFERROR stmt */
	Item *q1, *q2, *qerr;
	int blocktype;
{
	/* the solvq list is organized in groups of an item element
	followed by the method symbol( null if default to be used) */
	/* The itemtype field of the first is used to carry the blocktype*/
	/* SOLVE and METHOD method are deleted */
	/* The list now consists of triples in which the third element
	   is a list containing the complete IFERROR statement.
	*/
	Item *lq, *qtemp;
	List *errstmt;

	if (!solvq) {
		solvq = newlist();
	}
#if NMODL
	/* if the blocktype is equation then move the solve statement to
		the nrnstate function.  Everything else stays in the
		model function to be used as the nrncurrent function */
	if (blocktype == BREAKPOINT) {
		if (!nrnstate) {
			nrnstate = newlist();
		}
		Lappendstr(nrnstate, "{");
		if (qerr) {
			movelist(q1->prev, qerr, nrnstate);
		}else if (q2) {
			movelist(q1->prev, q2, nrnstate);
		}else{
			movelist(q1->prev, q1, nrnstate);
		}
		Lappendstr(nrnstate, "}");
	}
	/* verify that the block defintion for this SOLVE has not yet been seen */
	if (massage_list_) ITERATE(lq, massage_list_) {
		if (strcmp(SYM(lq)->name, SYM(q1)->name) == 0) {
diag("The SOLVE statement must be before the DERIVATIVE block for ", SYM(lq)->name);
		}
	}
#endif
	lq = lappendsym(solvq, SYM0);
	ITM(lq) = q1;
	lq->itemtype = blocktype;
	/* handle STEADYSTATE option */
	if (q1->next->itemtype == SYMBOL &&
	    strcmp("STEADYSTATE", SYM(q1->next)->name) == 0) {
		lq->itemtype = -blocktype; /* gets put back below */
	}
	if (q2) {
		qtemp = q2->next;	/* The IFERROR location */
		Lappendsym(solvq, SYM(q2));
		if (strcmp(SYM(q2)->name, "derivimplicit") == 0) {
			add_deriv_imp_list(SYM(q1)->name);
			add_deriv_imp_really(SYM(q1)->name);
		}
		if (strcmp(SYM(q2)->name, "cnexp") == 0) {
			SYM(q2)->name = stralloc("derivimplicit", SYM(q2)->name);
			add_deriv_imp_list(SYM(q1)->name);
#if CVODE
			cvode_cnexp_solve = lq;
#endif
		}
        // state functions for euler should be non-staic
        // deriv_imp_really list is used to track those functions
		if (strcmp(SYM(q2)->name, "euler") == 0) {
			add_deriv_imp_really(SYM(q1)->name);
		}
		delete(q2->prev);
		delete(q2);
	}else{
		qtemp = q1->next;
		Lappendsym(solvq, SYM0);
	}
	delete(q1->prev);

	/* handle the error statement */
	/* put one in if it isn't already there */
	if (qerr == ITEM0) {
#if NOCMODL
sprintf(buf, "if(error){fprintf(stderr,\"%s\\n\"); nrn_complain(_p); abort_run(error);}\n",
current_line());
		qtemp = qerr = insertstr(qtemp, buf);
#else
		qtemp = qerr = insertstr(qtemp,
"if(error){abort_run(error);}\n");
#endif
	}else{
		replacstr(qtemp, "if (error)");
	}
	errstmt = newlist();
	lq = lappendsym(solvq, SYM0);
	LST(lq) = errstmt;
	movelist(qtemp, qerr, errstmt);		
}